

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Zyx_ManAddCnfStart(Zyx_Man_t *p)

{
  uint uVar1;
  Bmc_EsPar_t *pBVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int pLits [32];
  int local_a8 [32];
  
  uVar1 = p->pPars->nVars;
  uVar8 = (ulong)uVar1;
  iVar3 = p->nObjs;
  if ((int)uVar1 < iVar3) {
    do {
      iVar9 = (int)uVar8;
      if (iVar9 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x297,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
      }
      iVar4 = p->TopoBase;
      pBVar2 = p->pPars;
      iVar5 = iVar4 * 2;
      uVar6 = 0;
      do {
        iVar7 = iVar9 - pBVar2->nVars;
        if (iVar3 * iVar7 + iVar4 + (int)uVar6 < 0) goto LAB_005ae67a;
        local_a8[uVar6] = iVar7 * iVar3 * 2 + iVar5;
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + 2;
      } while (uVar8 != uVar6);
      iVar3 = bmcg_sat_solver_addclause(p->pSat,local_a8,iVar9);
      if (iVar3 == 0) {
        return 0;
      }
      uVar8 = uVar8 + 1;
      iVar3 = p->nObjs;
    } while ((int)uVar8 < iVar3);
  }
  if (1 < iVar3) {
    iVar9 = 0;
    do {
      pBVar2 = p->pPars;
      iVar4 = pBVar2->nVars;
      if (iVar3 <= iVar4) {
LAB_005ae699:
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x2a2,"int Zyx_ManAddCnfStart(Zyx_Man_t *)");
      }
      iVar5 = p->TopoBase;
      uVar8 = 0;
      do {
        iVar7 = ((iVar4 + (int)uVar8) - pBVar2->nVars) * iVar3 + iVar5 + iVar9;
        if (iVar7 < 0) goto LAB_005ae67a;
        local_a8[uVar8] = iVar7 * 2;
        uVar8 = uVar8 + 1;
      } while ((uint)(iVar3 - iVar4) != uVar8);
      if (iVar3 == iVar4) goto LAB_005ae699;
      iVar3 = bmcg_sat_solver_addclause(p->pSat,local_a8,iVar3 - iVar4);
      if (iVar3 == 0) {
        return 0;
      }
      iVar9 = iVar9 + 1;
      iVar3 = p->nObjs;
    } while (iVar9 < iVar3 + -1);
  }
  if ((p->pPars->nLutSize == 2) && (iVar9 = p->pPars->nVars, iVar9 < iVar3)) {
    do {
      iVar3 = 3;
      do {
        pBVar2 = p->pPars;
        iVar4 = p->LutMask + 1;
        iVar5 = (iVar9 - pBVar2->nVars) * iVar4;
        if (iVar5 < -1) goto LAB_005ae67a;
        local_a8[0] = (uint)(iVar3 == 2) + iVar5 * 2 + 2;
        iVar5 = (iVar9 - pBVar2->nVars) * iVar4;
        if (iVar5 < -2) goto LAB_005ae67a;
        local_a8[1] = (uint)(iVar3 == 1) + iVar5 * 2 + 4;
        iVar4 = (iVar9 - pBVar2->nVars) * iVar4;
        if (iVar4 < -3) goto LAB_005ae67a;
        local_a8[2] = (uint)(iVar3 != 3) + iVar4 * 2 + 6;
        iVar4 = bmcg_sat_solver_addclause(p->pSat,local_a8,3);
        if (iVar4 == 0) {
          return 0;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      pBVar2 = p->pPars;
      if (pBVar2->fOnlyAnd != 0) {
        iVar3 = p->LutMask + 1;
        iVar4 = (iVar9 - pBVar2->nVars) * iVar3;
        if (iVar4 < -1) {
LAB_005ae67a:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_a8[0] = iVar4 * 2 + 3;
        iVar4 = (iVar9 - pBVar2->nVars) * iVar3;
        if (iVar4 < -2) goto LAB_005ae67a;
        local_a8[1] = iVar4 * 2 + 5;
        iVar3 = (iVar9 - pBVar2->nVars) * iVar3;
        if (iVar3 < -3) goto LAB_005ae67a;
        local_a8[2] = iVar3 * 2 + 6;
        iVar3 = bmcg_sat_solver_addclause(p->pSat,local_a8,3);
        if (iVar3 == 0) {
          return 0;
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->nObjs);
  }
  return 1;
}

Assistant:

int Zyx_ManAddCnfStart( Zyx_Man_t * p )
{
    // nodes have fanins
    int i, k, pLits[MAJ3_OBJS];
    //printf( "Adding initial clauses:\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nLits = 0;
        for ( k = 0; k < i; k++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // nodes have fanouts
    for ( k = 0; k < p->nObjs-1; k++ )
    {
        int nLits = 0;
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
            pLits[nLits++] = Abc_Var2Lit( Zyx_TopoVar(p, i, k), 0 );
        assert( nLits > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
            return 0;
    }
 
    // two input functions
    if ( p->pPars->nLutSize != 2 )
        return 1;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), k==1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), k==2 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), k!=0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
        if ( p->pPars->fOnlyAnd )
        {
            pLits[0] = Abc_Var2Lit( Zyx_FuncVar(p, i, 1), 1 );
            pLits[1] = Abc_Var2Lit( Zyx_FuncVar(p, i, 2), 1 );
            pLits[2] = Abc_Var2Lit( Zyx_FuncVar(p, i, 3), 0 );
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, 3 ) )
                return 0;
        }
    }
    return 1;
}